

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_open.c
# Opt level: O1

int main(void)

{
  _PDCLIB_fd_t _Var1;
  int iVar2;
  int *piVar3;
  char *__s;
  ssize_t sVar4;
  __off_t _Var5;
  char buffer [10];
  short local_1a;
  undefined2 uStack_18;
  short sStack_16;
  undefined2 uStack_14;
  short local_12;
  
  remove("test_support/testfile");
  _Var1 = _PDCLIB_open("test_support/testfile",8);
  if (_Var1 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,100,"_PDCLIB_open( testfile, _PDCLIB_FREAD ) == _PDCLIB_NOHANDLE");
  }
  _Var1 = _PDCLIB_open("test_support/testfile",0x10);
  if (_Var1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x66,"( fh = _PDCLIB_open( testfile, _PDCLIB_FWRITE ) ) != _PDCLIB_NOHANDLE");
  }
  piVar3 = __errno_location();
  __s = strerror(*piVar3);
  puts(__s);
  sVar4 = write(_Var1,"test",4);
  if (sVar4 != 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x68,"write( fh, \"test\", 4 ) == 4");
  }
  _Var5 = lseek(_Var1,0,0);
  if (_Var5 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x69,"lseek( fh, 0, SEEK_SET ) == 0");
  }
  sVar4 = read(_Var1,&local_1a,4);
  if (sVar4 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x6a,"read( fh, buffer, 4 ) == -1");
  }
  iVar2 = _PDCLIB_close(_Var1);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x6b,"_PDCLIB_close( fh ) == 0");
  }
  _Var1 = _PDCLIB_open("test_support/testfile",8);
  if (_Var1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x6d,"( fh = _PDCLIB_open( testfile, _PDCLIB_FREAD ) ) != _PDCLIB_NOHANDLE");
  }
  sVar4 = write(_Var1,"test",4);
  if (sVar4 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x6e,"write( fh, \"test\", 4 ) == -1");
  }
  iVar2 = _PDCLIB_close(_Var1);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x6f,"_PDCLIB_close( fh ) == 0");
  }
  _Var1 = _PDCLIB_open("test_support/testfile",0x20);
  if (_Var1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x71,"( fh = _PDCLIB_open( testfile, _PDCLIB_FAPPEND ) ) != _PDCLIB_NOHANDLE");
  }
  sVar4 = write(_Var1,"app",3);
  if (sVar4 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x72,"write( fh, \"app\", 3 ) == 3");
  }
  _Var5 = lseek(_Var1,0,0);
  if (_Var5 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x73,"lseek( fh, 0, SEEK_SET ) == 0");
  }
  sVar4 = read(_Var1,&local_1a,10);
  if (sVar4 != -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x74,"read( fh, buffer, 10 ) == -1");
  }
  sVar4 = write(_Var1,"end",3);
  if (sVar4 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x75,"write( fh, \"end\", 3 ) == 3");
  }
  iVar2 = _PDCLIB_close(_Var1);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x76,"_PDCLIB_close( fh ) == 0");
  }
  _Var1 = _PDCLIB_open("test_support/testfile",0x48);
  if (_Var1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x78,
           "( fh = _PDCLIB_open( testfile, _PDCLIB_FREAD | _PDCLIB_FRW ) ) != _PDCLIB_NOHANDLE");
  }
  sVar4 = read(_Var1,&local_1a,10);
  if (sVar4 != 10) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x79,"read( fh, buffer, 10 ) == 10");
  }
  if (local_12 != 0x646e ||
      CONCAT26(uStack_14,CONCAT24(sStack_16,CONCAT22(uStack_18,local_1a))) != 0x6570706174736574) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x7a,"memcmp( buffer, \"testappend\", 10 ) == 0");
  }
  _Var5 = lseek(_Var1,0,0);
  if (_Var5 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x7b,"lseek( fh, 0, SEEK_SET ) == 0");
  }
  sVar4 = write(_Var1,"wedo",4);
  if (sVar4 != 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x7c,"write( fh, \"wedo\", 4 ) == 4");
  }
  _Var5 = lseek(_Var1,0,0);
  if (_Var5 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x7d,"lseek( fh, 0, SEEK_SET ) == 0");
  }
  sVar4 = read(_Var1,&local_1a,10);
  if (sVar4 != 10) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x7e,"read( fh, buffer, 10 ) == 10");
  }
  if (local_12 != 0x646e ||
      CONCAT26(uStack_14,CONCAT24(sStack_16,CONCAT22(uStack_18,local_1a))) != 0x657070616f646577) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x7f,"memcmp( buffer, \"wedoappend\", 10 ) == 0");
  }
  iVar2 = _PDCLIB_close(_Var1);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x80,"_PDCLIB_close( fh ) == 0");
  }
  _Var1 = _PDCLIB_open("test_support/testfile",0x50);
  if (_Var1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x82,
           "( fh = _PDCLIB_open( testfile, _PDCLIB_FWRITE | _PDCLIB_FRW ) ) != _PDCLIB_NOHANDLE");
  }
  sVar4 = write(_Var1,"test",4);
  if (sVar4 != 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x83,"write( fh, \"test\", 4 ) == 4");
  }
  _Var5 = lseek(_Var1,1,0);
  if (_Var5 != 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x84,"lseek( fh, 1, SEEK_SET ) == 1");
  }
  sVar4 = read(_Var1,&local_1a,2);
  if (sVar4 != 2) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x85,"read( fh, buffer, 2 ) == 2");
  }
  if (local_1a != 0x7365) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x86,"memcmp( buffer, \"es\", 2 ) == 0");
  }
  sVar4 = write(_Var1,"sie",3);
  if (sVar4 != 3) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x87,"write( fh, \"sie\", 3 ) == 3");
  }
  _Var5 = lseek(_Var1,0,0);
  if (_Var5 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x88,"lseek( fh, 0, SEEK_SET ) == 0");
  }
  sVar4 = read(_Var1,&local_1a,6);
  if (sVar4 != 6) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x89,"read( fh, buffer, 6 ) == 6");
  }
  if (sStack_16 != 0x6569 || CONCAT22(uStack_18,local_1a) != 0x73736574) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x8a,"memcmp( buffer, \"tessie\", 6 ) == 0");
  }
  iVar2 = _PDCLIB_close(_Var1);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x8b,"_PDCLIB_close( fh ) == 0");
  }
  _Var1 = _PDCLIB_open("test_support/testfile",0x60);
  if (_Var1 == -1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x8d,
           "( fh = _PDCLIB_open( testfile, _PDCLIB_FAPPEND | _PDCLIB_FRW ) ) != _PDCLIB_NOHANDLE");
  }
  sVar4 = write(_Var1,"baby",4);
  if (sVar4 != 4) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x8e,"write( fh, \"baby\", 4 ) == 4");
  }
  _Var5 = lseek(_Var1,0,0);
  if (_Var5 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x8f,"lseek( fh, 0, SEEK_SET ) == 0");
  }
  sVar4 = read(_Var1,&local_1a,10);
  if (sVar4 != 10) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x90,"read( fh, buffer, 10 ) == 10");
  }
  if (local_12 != 0x7962 ||
      CONCAT26(uStack_14,CONCAT24(sStack_16,CONCAT22(uStack_18,local_1a))) != 0x6162656973736574) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x91,"memcmp( buffer, \"tessiebaby\", 10 ) == 0");
  }
  iVar2 = _PDCLIB_close(_Var1);
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x92,"_PDCLIB_close( fh ) == 0");
  }
  iVar2 = remove("test_support/testfile");
  if (iVar2 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/platform/example/functions/_PDCLIB/_PDCLIB_open.c, line %d - %s\n"
           ,0x94,"remove( testfile ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    /* This testdriver assumes POSIX, i.e. _PDCLIB_fd_t being int and being
       incremented by one on each successful open.
    */
    _PDCLIB_fd_t fh;
    char buffer[ 10 ];
    remove( testfile );
    /* Trying to read non-existent file. */
    TESTCASE( _PDCLIB_open( testfile, _PDCLIB_FREAD ) == _PDCLIB_NOHANDLE );
    /* Writing to file, trying to read from it. */
    TESTCASE( ( fh = _PDCLIB_open( testfile, _PDCLIB_FWRITE ) ) != _PDCLIB_NOHANDLE );
    puts( strerror( errno ) );
    TESTCASE( write( fh, "test", 4 ) == 4 );
    TESTCASE( lseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( read( fh, buffer, 4 ) == -1 );
    TESTCASE( _PDCLIB_close( fh ) == 0 );
    /* Reading from file, trying to write to it. */
    TESTCASE( ( fh = _PDCLIB_open( testfile, _PDCLIB_FREAD ) ) != _PDCLIB_NOHANDLE );
    TESTCASE( write( fh, "test", 4 ) == -1 );
    TESTCASE( _PDCLIB_close( fh ) == 0 );
    /* Appending to file, trying to read from it. */
    TESTCASE( ( fh = _PDCLIB_open( testfile, _PDCLIB_FAPPEND ) ) != _PDCLIB_NOHANDLE );
    TESTCASE( write( fh, "app", 3 ) == 3 );
    TESTCASE( lseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( read( fh, buffer, 10 ) == -1 );
    TESTCASE( write( fh, "end", 3 ) == 3 );
    TESTCASE( _PDCLIB_close( fh ) == 0 );
    /* Reading and writing from file ("r+"). */
    TESTCASE( ( fh = _PDCLIB_open( testfile, _PDCLIB_FREAD | _PDCLIB_FRW ) ) != _PDCLIB_NOHANDLE );
    TESTCASE( read( fh, buffer, 10 ) == 10 );
    TESTCASE( memcmp( buffer, "testappend", 10 ) == 0 );
    TESTCASE( lseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( write( fh, "wedo", 4 ) == 4 );
    TESTCASE( lseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( read( fh, buffer, 10 ) == 10 );
    TESTCASE( memcmp( buffer, "wedoappend", 10 ) == 0 );
    TESTCASE( _PDCLIB_close( fh ) == 0 );
    /* Writing and reading from file ("w+"). */
    TESTCASE( ( fh = _PDCLIB_open( testfile, _PDCLIB_FWRITE | _PDCLIB_FRW ) ) != _PDCLIB_NOHANDLE );
    TESTCASE( write( fh, "test", 4 ) == 4 );
    TESTCASE( lseek( fh, 1, SEEK_SET ) == 1 );
    TESTCASE( read( fh, buffer, 2 ) == 2 );
    TESTCASE( memcmp( buffer, "es", 2 ) == 0 );
    TESTCASE( write( fh, "sie", 3 ) == 3 );
    TESTCASE( lseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( read( fh, buffer, 6 ) == 6 );
    TESTCASE( memcmp( buffer, "tessie", 6 ) == 0 );
    TESTCASE( _PDCLIB_close( fh ) == 0 );
    /* Appending and reading from file ("a+"). */
    TESTCASE( ( fh = _PDCLIB_open( testfile, _PDCLIB_FAPPEND | _PDCLIB_FRW ) ) != _PDCLIB_NOHANDLE );
    TESTCASE( write( fh, "baby", 4 ) == 4 );
    TESTCASE( lseek( fh, 0, SEEK_SET ) == 0 );
    TESTCASE( read( fh, buffer, 10 ) == 10 );
    TESTCASE( memcmp( buffer, "tessiebaby", 10 ) == 0 );
    TESTCASE( _PDCLIB_close( fh ) == 0 );
    /* Cleaning up. */
    TESTCASE( remove( testfile ) == 0 );
#endif
    return TEST_RESULTS;
}